

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read_optics_file_from_disk.unit.cpp
# Opt level: O2

void __thiscall
TestLoadOpticsFileFromDisk_TestLoadDiffuseData_Test::
TestLoadOpticsFileFromDisk_TestLoadDiffuseData_Test
          (TestLoadOpticsFileFromDisk_TestLoadDiffuseData_Test *this)

{
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_001c8de0;
  return;
}

Assistant:

TEST(TestLoadOpticsFileFromDisk, TestLoadDiffuseData)
{
    SCOPED_TRACE(
      "Begin Test: Load a file with diffuse data from disk (diffuse_optics_file_2.txt).");

    std::string product_path(TEST_DATA_DIR);
    product_path += "/products";
    product_path += "/diffuse_optics_file_2.txt";

    OpticsParser::Parser parser;
    auto product = parser.parseFile(product_path);
    EXPECT_EQ(product.nfrcid, std::optional<int>());
    EXPECT_EQ(product.productName, "Generic frit 38mm aperture");
    EXPECT_EQ("glazing", product.productType);
    EXPECT_EQ("Coated", product.productSubtype);
    EXPECT_EQ(product.thickness.value(), 6.0);
    EXPECT_EQ(product.conductivity, 1.0);
    EXPECT_EQ(product.IRTransmittance.value(), 0.0);
    EXPECT_EQ(product.frontEmissivity.value(), 0.86);
    EXPECT_EQ(product.backEmissivity.value(), 0.86);
    auto & givenMeasurements =
      std::get<std::vector<OpticsParser::WLData>>(product.measurements.value());
    EXPECT_EQ(givenMeasurements.size(), 451);
    EXPECT_EQ(givenMeasurements[0].wavelength, 0.250);
    EXPECT_EQ(givenMeasurements[0].directComponent.value().tf, 0.001);
    EXPECT_EQ(givenMeasurements[0].directComponent.value().tb, 0.006);
    EXPECT_EQ(givenMeasurements[0].directComponent.value().rf, 0.011);
    EXPECT_EQ(givenMeasurements[0].directComponent.value().rb, 0.006);
    EXPECT_EQ(givenMeasurements[0].diffuseComponent.value().tf, 0.002);
    EXPECT_EQ(givenMeasurements[0].diffuseComponent.value().tb, 0.076);
    EXPECT_EQ(givenMeasurements[0].diffuseComponent.value().rf, 0.087);
    EXPECT_EQ(givenMeasurements[0].diffuseComponent.value().rb, 0.131);
    EXPECT_EQ(givenMeasurements[450].wavelength, 2.5);
    EXPECT_EQ(givenMeasurements[450].directComponent.value().tf, 0.520);
    EXPECT_EQ(givenMeasurements[450].directComponent.value().tb, 0.528);
    EXPECT_EQ(givenMeasurements[450].directComponent.value().rf, 0.000);
    EXPECT_EQ(givenMeasurements[450].directComponent.value().rb, 0.000);
    EXPECT_EQ(givenMeasurements[450].diffuseComponent.value().tf, 0.238);
    EXPECT_EQ(givenMeasurements[450].diffuseComponent.value().tb, 0.240);
    EXPECT_EQ(givenMeasurements[450].diffuseComponent.value().rf, 0.0970);
    EXPECT_EQ(givenMeasurements[450].diffuseComponent.value().rb, 0.0940);
    EXPECT_EQ(product.frontEmissivitySource, std::optional<std::string>());
    EXPECT_EQ(product.backEmissivitySource, std::optional<std::string>());
    EXPECT_EQ(product.manufacturer, "LBNL demo");
    EXPECT_EQ(product.material, std::optional<std::string>());
    EXPECT_EQ(product.coatingName, "Generic clear frit");
    EXPECT_EQ(product.coatedSide, "Back");
    EXPECT_EQ(product.substrateFilename, "CLEAR_6.DAT");
    EXPECT_EQ(product.appearance, "Hazy");
    EXPECT_EQ(product.acceptance, std::optional<std::string>());
    EXPECT_EQ(product.unitSystem, "SI");
    EXPECT_EQ(product.wavelengthUnit, "Microns");
    EXPECT_EQ(product.permeabilityFactor, 0.0);
}